

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall PcodeOp::printDebug(PcodeOp *this,ostream *s)

{
  bool bVar1;
  ostream *poVar2;
  ostream *s_local;
  PcodeOp *this_local;
  
  poVar2 = ::operator<<(s,&this->start);
  std::operator<<(poVar2,": ");
  bVar1 = isDead(this);
  if ((bVar1) || (this->parent == (BlockBasic *)0x0)) {
    std::operator<<(s,"**");
  }
  else {
    printRaw(this,s);
  }
  return;
}

Assistant:

void PcodeOp::printDebug(ostream &s) const

{
  s << start << ": ";
  if (isDead()||(parent==(BlockBasic *)0))
    s << "**";
  else
    printRaw(s);
}